

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManDupWithConstrCollectAnd_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper,int fFirst)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  
  do {
    if (((ulong)pObj & 1) == 0) {
      uVar6 = *(ulong *)pObj;
      uVar3 = uVar6 & 0x1fffffff;
      if (fFirst == 0 && (uVar3 == 0x1fffffff || (int)uVar6 < 0)) {
        iVar2 = 0;
LAB_0068777d:
        pGVar8 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
        pGVar1 = p->pObjs;
        if ((pGVar1 <= pGVar8) && (pGVar8 < pGVar1 + p->nObjs)) {
          iVar7 = (int)((ulong)((long)pGVar8 - (long)pGVar1) >> 2);
          if (iVar7 * -0x55555555 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10b,"int Abc_Var2Lit(int, int)");
          }
          iVar2 = iVar2 + iVar7 * 0x55555556;
          if (0 < (long)vSuper->nSize) {
            lVar5 = 0;
            do {
              if (vSuper->pArray[lVar5] == iVar2) {
                return;
              }
              lVar5 = lVar5 + 1;
            } while (vSuper->nSize != lVar5);
          }
          Vec_IntPush(vSuper,iVar2);
          return;
        }
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
    }
    else {
      if (fFirst == 0) {
        iVar2 = 1;
        goto LAB_0068777d;
      }
      uVar6 = *(ulong *)pObj;
      uVar3 = (ulong)((uint)uVar6 & 0x1fffffff);
    }
    fFirst = 0;
    Gia_ManDupWithConstrCollectAnd_rec
              (p,(Gia_Obj_t *)((ulong)((uint)(uVar6 >> 0x1d) & 1) ^ (ulong)(pObj + -uVar3)),vSuper,0
              );
    uVar4 = (uint)(*(ulong *)pObj >> 0x20);
    pObj = (Gia_Obj_t *)((ulong)(uVar4 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar4 & 0x1fffffff)));
  } while( true );
}

Assistant:

void Gia_ManDupWithConstrCollectAnd_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper, int fFirst )
{
    if ( (Gia_IsComplement(pObj) || !Gia_ObjIsAnd(pObj)) && !fFirst )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild0(pObj), vSuper, 0 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild1(pObj), vSuper, 0 );
}